

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcard.c
# Opt level: O0

int wc_match_inner(char *wildcard,char *target,size_t target_len)

{
  size_t sVar1;
  char *pcVar2;
  int iVar3;
  char *target_end_00;
  char *save_t;
  char *save_w;
  int ret;
  char *target_end;
  size_t target_len_local;
  char *target_local;
  char *wildcard_local;
  
  target_end_00 = target + target_len;
  target_len_local = (size_t)target;
  target_local = wildcard;
  if ((*wildcard == '*') ||
     (wildcard_local._4_4_ =
           wc_match_fragment(&target_local,(char **)&target_len_local,target_end_00),
     0 < wildcard_local._4_4_)) {
    do {
      if (*target_local == '\0') {
        return (uint)((char *)target_len_local == target_end_00);
      }
      if (*target_local != '*') {
        __assert_fail("*wildcard == \'*\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/wildcard.c"
                      ,0xe4,"int wc_match_inner(const char *, const char *, size_t)");
      }
      for (; *target_local == '*'; target_local = target_local + 1) {
      }
      if (*target_local == '\0') {
        return 1;
      }
      save_w._4_4_ = 0;
      for (; pcVar2 = target_local, sVar1 = target_len_local, *(char *)target_len_local != '\0';
          target_len_local = target_len_local + 1) {
        save_w._4_4_ = wc_match_fragment(&target_local,(char **)&target_len_local,target_end_00);
        if (save_w._4_4_ < 0) {
          return save_w._4_4_;
        }
        if (((0 < save_w._4_4_) && (*target_local == '\0')) &&
           ((char *)target_len_local != target_end_00)) {
          target_len_local = (long)target_end_00 - (target_len_local - sVar1);
          target_local = pcVar2;
          iVar3 = wc_match_fragment(&target_local,(char **)&target_len_local,target_end_00);
          return iVar3;
        }
        if (0 < save_w._4_4_) break;
      }
    } while (0 < save_w._4_4_);
    wildcard_local._4_4_ = 0;
  }
  return wildcard_local._4_4_;
}

Assistant:

static int wc_match_inner(
    const char *wildcard, const char *target, size_t target_len)
{
    const char *target_end = target + target_len;
    int ret;

    /*
     * Every time we see a '*' _followed_ by a fragment, we just
     * search along the string for a location at which the fragment
     * matches. The only special case is when we see a fragment
     * right at the start, in which case we just call the matching
     * routine once and give up if it fails.
     */
    if (*wildcard != '*') {
        ret = wc_match_fragment(&wildcard, &target, target_end);
        if (ret <= 0)
            return ret;                /* pass back failure or error alike */
    }

    while (*wildcard) {
        assert(*wildcard == '*');
        while (*wildcard == '*')
            wildcard++;

        /*
         * It's possible we've just hit the end of the wildcard
         * after seeing a *, in which case there's no need to
         * bother searching any more because we've won.
         */
        if (!*wildcard)
            return 1;

        /*
         * Now `wildcard' points at the next fragment. So we
         * attempt to match it against `target', and if that fails
         * we increment `target' and try again, and so on. When we
         * find we're about to try matching against the empty
         * string, we give up and return 0.
         */
        ret = 0;
        while (*target) {
            const char *save_w = wildcard, *save_t = target;

            ret = wc_match_fragment(&wildcard, &target, target_end);

            if (ret < 0)
                return ret;            /* syntax error */

            if (ret > 0 && !*wildcard && target != target_end) {
                /*
                 * Final special case - literally.
                 *
                 * This situation arises when we are matching a
                 * _terminal_ fragment of the wildcard (that is,
                 * there is nothing after it, e.g. "*a"), and it
                 * has matched _too early_. For example, matching
                 * "*a" against "parka" will match the "a" fragment
                 * against the _first_ a, and then (if it weren't
                 * for this special case) matching would fail
                 * because we're at the end of the wildcard but not
                 * at the end of the target string.
                 *
                 * In this case what we must do is measure the
                 * length of the fragment in the target (which is
                 * why we saved `target'), jump straight to that
                 * distance from the end of the string using
                 * strlen, and match the same fragment again there
                 * (which is why we saved `wildcard'). Then we
                 * return whatever that operation returns.
                 */
                target = target_end - (target - save_t);
                wildcard = save_w;
                return wc_match_fragment(&wildcard, &target, target_end);
            }

            if (ret > 0)
                break;
            target++;
        }
        if (ret > 0)
            continue;
        return 0;
    }

    /*
     * If we reach here, it must be because we successfully matched
     * a fragment and then found ourselves right at the end of the
     * wildcard. Hence, we return 1 if and only if we are also
     * right at the end of the target.
     */
    return target == target_end;
}